

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::(anonymous_namespace)::
     verifyGatherOffsets<float,tcu::LookupPrecision,tcu::Texture2DView,tcu::Vector<float,2>>
               (TestLog *log,ConstPixelBufferAccess *result,Texture2DView *texture,
               Vector<float,_2> (*texCoords) [4],Sampler *sampler,LookupPrecision *lookupPrec,
               int componentNdx,PixelOffsets *getPixelOffsets)

{
  void **this;
  int x;
  byte bVar1;
  bool bVar2;
  int width_00;
  int height_00;
  TextureFormat *format;
  TestLog *pTVar3;
  float xFactor;
  float yFactor;
  Vector<int,_2> *local_518;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  LogImage local_4b0;
  ConstPixelBufferAccess local_420;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  LogImage local_3a8;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  LogImage local_2c8;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  LogImageSet local_1e8;
  deUint32 local_1a4;
  Vector<float,_4> local_1a0;
  Vector<float,_4> local_190;
  Vector<bool,_4> local_180;
  Vector<bool,_4> local_17c;
  undefined1 local_178 [8];
  ColorVec idealPix;
  ColorVec resultPix;
  Vector<float,_2> texCoord;
  Vector<float,_2> local_148;
  Vector<float,_2> local_140;
  Vector<float,_2> local_138;
  Vec2 viewportCoord;
  Vector<int,_2> local_128;
  IVec2 offsets [4];
  int local_100;
  int px;
  int py;
  PixelBufferAccess local_e8;
  byte local_b9;
  undefined1 local_b8 [7];
  bool success;
  Surface errorMask;
  undefined1 local_90 [8];
  PixelBufferAccess idealAccess;
  TextureLevel ideal;
  int height;
  int width;
  LookupPrecision *lookupPrec_local;
  Sampler *sampler_local;
  Vector<float,_2> (*texCoords_local) [4];
  Texture2DView *texture_local;
  ConstPixelBufferAccess *result_local;
  TestLog *log_local;
  
  width_00 = tcu::ConstPixelBufferAccess::getWidth(result);
  height_00 = tcu::ConstPixelBufferAccess::getWidth(result);
  format = tcu::ConstPixelBufferAccess::getFormat(result);
  this = &idealAccess.super_ConstPixelBufferAccess.m_data;
  tcu::TextureLevel::TextureLevel((TextureLevel *)this,format,width_00,height_00,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_90,(TextureLevel *)this);
  tcu::Surface::Surface((Surface *)local_b8,width_00,height_00);
  local_b9 = 1;
  tcu::Surface::getAccess(&local_e8,(Surface *)local_b8);
  tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&py);
  tcu::clear(&local_e8,(Vec4 *)&py);
  for (local_100 = 0; local_100 < height_00; local_100 = local_100 + 1) {
    for (offsets[3].m_data[1] = 0; offsets[3].m_data[1] < width_00;
        offsets[3].m_data[1] = offsets[3].m_data[1] + 1) {
      local_518 = &local_128;
      do {
        tcu::Vector<int,_2>::Vector(local_518);
        local_518 = local_518 + 1;
      } while (local_518 != offsets + 3);
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&viewportCoord,offsets[3].m_data[1],local_100);
      (**getPixelOffsets->_vptr_PixelOffsets)(getPixelOffsets,&viewportCoord,&local_128);
      tcu::Vector<float,_2>::Vector(&local_148,(float)offsets[3].m_data[1],(float)local_100);
      tcu::operator+((tcu *)&local_140,&local_148,0.5);
      tcu::Vector<float,_2>::Vector(&texCoord,(float)width_00,(float)height_00);
      tcu::operator/((tcu *)&local_138,&local_140,&texCoord);
      xFactor = tcu::Vector<float,_2>::x(&local_138);
      yFactor = tcu::Vector<float,_2>::y(&local_138);
      triQuadInterpolate<tcu::Vector<float,2>>
                ((_anonymous_namespace_ *)(resultPix.m_data + 2),texCoords,xFactor,yFactor);
      tcu::ConstPixelBufferAccess::getPixelT<float>
                ((ConstPixelBufferAccess *)(idealPix.m_data + 2),(int)result,offsets[3].m_data[1],
                 local_100);
      Functional::anon_unknown_0::gatherOffsets<float>
                ((anon_unknown_0 *)local_178,texture,sampler,(Vec2 *)(resultPix.m_data + 2),
                 componentNdx,(IVec2 (*) [4])&local_128);
      tcu::PixelBufferAccess::setPixel
                ((PixelBufferAccess *)local_90,(Vec4 *)local_178,offsets[3].m_data[1],local_100,0);
      tcu::absDiff<float,4>
                ((tcu *)&local_190,(Vector<float,_4> *)(idealPix.m_data + 2),
                 (Vector<float,_4> *)local_178);
      tcu::Vector<float,_4>::cast<float>(&local_1a0);
      tcu::greaterThan<float,4>((tcu *)&local_180,&local_190,&local_1a0);
      tcu::logicalAnd<bool,4>((tcu *)&local_17c,&lookupPrec->colorMask,&local_180);
      bVar2 = tcu::boolAny<4>(&local_17c);
      if ((bVar2) &&
         (bVar2 = tcu::isGatherOffsetsResultValid
                            (texture,sampler,lookupPrec,(Vec2 *)(resultPix.m_data + 2),componentNdx,
                             (IVec2 (*) [4])&local_128,(Vec4 *)(idealPix.m_data + 2)),
         x = offsets[3].m_data[1], !bVar2)) {
        local_1a4 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)local_b8,x,local_100,(RGBA)local_1a4);
        local_b9 = 0;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"VerifyResult",&local_209)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"Verification result",&local_231);
  tcu::LogImageSet::LogImageSet(&local_1e8,&local_208,&local_230);
  pTVar3 = tcu::TestLog::operator<<(log,&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"Rendered",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"Rendered image",&local_311);
  tcu::LogImage::LogImage(&local_2c8,&local_2e8,&local_310,result,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar3,&local_2c8);
  tcu::LogImage::~LogImage(&local_2c8);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  tcu::LogImageSet::~LogImageSet(&local_1e8);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  if ((local_b9 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Reference",&local_3c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,"Ideal reference image",&local_3f1);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&local_420,(TextureLevel *)&idealAccess.super_ConstPixelBufferAccess.m_data);
    tcu::LogImage::LogImage
              (&local_3a8,&local_3c8,&local_3f0,&local_420,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar3 = tcu::TestLog::operator<<(log,&local_3a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"ErrorMask",&local_4d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"Error mask",&local_4f9)
    ;
    tcu::LogImage::LogImage
              (&local_4b0,&local_4d0,&local_4f8,(Surface *)local_b8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar3,&local_4b0);
    tcu::LogImage::~LogImage(&local_4b0);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator(&local_4f9);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    tcu::LogImage::~LogImage(&local_3a8);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator(&local_3c9);
  }
  tcu::TestLog::operator<<(log,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  bVar1 = local_b9;
  tcu::Surface::~Surface((Surface *)local_b8);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&idealAccess.super_ConstPixelBufferAccess.m_data)
  ;
  return (bool)(bVar1 & 1);
}

Assistant:

static bool verifyGatherOffsets (TestLog&						log,
								 const ConstPixelBufferAccess&	result,
								 const TexViewT&				texture,
								 const TexCoordT				(&texCoords)[4],
								 const tcu::Sampler&			sampler,
								 const PrecType&				lookupPrec,
								 int							componentNdx,
								 const PixelOffsets&			getPixelOffsets)
{
	typedef tcu::Vector<ColorScalarType, 4> ColorVec;

	const int					width			= result.getWidth();
	const int					height			= result.getWidth();
	tcu::TextureLevel			ideal			(result.getFormat(), width, height);
	const PixelBufferAccess		idealAccess		= ideal.getAccess();
	tcu::Surface				errorMask		(width, height);
	bool						success			= true;

	tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toVec());

	for (int py = 0; py < height; py++)
	for (int px = 0; px < width; px++)
	{
		IVec2		offsets[4];
		getPixelOffsets(IVec2(px, py), offsets);

		const Vec2			viewportCoord	= (Vec2((float)px, (float)py) + 0.5f) / Vec2((float)width, (float)height);
		const TexCoordT		texCoord		= triQuadInterpolate(texCoords, viewportCoord.x(), viewportCoord.y());
		const ColorVec		resultPix		= result.getPixelT<ColorScalarType>(px, py);
		const ColorVec		idealPix		= gatherOffsets<ColorScalarType>(texture, sampler, texCoord, componentNdx, offsets);

		idealAccess.setPixel(idealPix, px, py);

		if (tcu::boolAny(tcu::logicalAnd(lookupPrec.colorMask,
										 tcu::greaterThan(tcu::absDiff(resultPix, idealPix),
														  lookupPrec.colorThreshold.template cast<ColorScalarType>()))))
		{
			if (!isGatherOffsetsResultValid(texture, sampler, lookupPrec, texCoord, componentNdx, offsets, resultPix))
			{
				errorMask.setPixel(px, py, tcu::RGBA::red());
				success = false;
			}
		}
	}

	log << TestLog::ImageSet("VerifyResult", "Verification result")
		<< TestLog::Image("Rendered", "Rendered image", result);

	if (!success)
	{
		log << TestLog::Image("Reference", "Ideal reference image", ideal)
			<< TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << TestLog::EndImageSet;

	return success;
}